

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<7UL> mserialize::cx_strcat<7ul>(cx_string<7UL> *strings)

{
  char *pcVar1;
  cx_string<7UL> cVar2;
  bool bVar3;
  size_t s;
  long lVar4;
  char buffer [8];
  char local_18 [8];
  cx_string<7UL> local_10;
  
  pcVar1 = local_18;
  local_18[0] = '\0';
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[6] = '\0';
  local_18[7] = '\0';
  bVar3 = true;
  while (bVar3) {
    for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
      pcVar1[lVar4] = strings->_data[lVar4];
    }
    pcVar1 = pcVar1 + 7;
    bVar3 = false;
  }
  cx_string<7UL>::cx_string(&local_10,local_18);
  cVar2._data[0] = local_10._data[0];
  cVar2._data[1] = local_10._data[1];
  cVar2._data[2] = local_10._data[2];
  cVar2._data[3] = local_10._data[3];
  cVar2._data[4] = local_10._data[4];
  cVar2._data[5] = local_10._data[5];
  cVar2._data[6] = local_10._data[6];
  cVar2._data[7] = local_10._data[7];
  return (cx_string<7UL>)cVar2._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}